

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O0

void Dau_DsdMergeVarPres(char *pDsd,int *pMatches,int *pPres,int Mask)

{
  bool bVar1;
  int local_28;
  int i;
  int Mask_local;
  int *pPres_local;
  int *pMatches_local;
  char *pDsd_local;
  
  local_28 = 0;
  do {
    if (pDsd[local_28] == '\0') {
      return;
    }
    if ((pDsd[local_28] == '<') && (pDsd[pMatches[local_28] + 1] == '{')) {
      local_28 = pMatches[local_28] + 1;
    }
    if ((('@' < pDsd[local_28]) && (pDsd[local_28] < 'G')) ||
       (('/' < pDsd[local_28] && (pDsd[local_28] < ':')))) {
      while( true ) {
        if (((pDsd[local_28] < 'A') || (bVar1 = true, 'F' < pDsd[local_28])) &&
           (bVar1 = false, '/' < pDsd[local_28])) {
          bVar1 = pDsd[local_28] < ':';
        }
        if (!bVar1) break;
        local_28 = local_28 + 1;
      }
    }
    if (('`' < pDsd[local_28]) && (pDsd[local_28] < '{')) {
      if (0xb < pDsd[local_28] + -0x61) {
        __assert_fail("pDsd[i]-\'a\' < DAU_MAX_VAR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0xc1,"void Dau_DsdMergeVarPres(char *, int *, int *, int)");
      }
      pPres[pDsd[local_28] + -0x61] = Mask | pPres[pDsd[local_28] + -0x61];
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static inline void Dau_DsdMergeVarPres( char * pDsd, int * pMatches, int * pPres, int Mask )
{
    int i;
    for ( i = 0; pDsd[i]; i++ )
    {
        // skip non-DSD block
        if ( pDsd[i] == '<' && pDsd[pMatches[i]+1] == '{' )
            i = pMatches[i] + 1;
        if ( (pDsd[i] >= 'A' && pDsd[i] <= 'F') || (pDsd[i] >= '0' && pDsd[i] <= '9') )
            while ( (pDsd[i] >= 'A' && pDsd[i] <= 'F') || (pDsd[i] >= '0' && pDsd[i] <= '9') )
                i++;
        // skip non-variables
        if ( !(pDsd[i] >= 'a' && pDsd[i] <= 'z') )
            continue;
        // record the mask
        assert( pDsd[i]-'a' < DAU_MAX_VAR );
        pPres[pDsd[i]-'a'] |= Mask;
    }
}